

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.cpp
# Opt level: O0

size_t Jupiter_base64encode(void *data_buf,size_t dataLength,char *result)

{
  char *pcVar1;
  ulong local_90;
  size_t x;
  int local_80;
  uint8_t n3;
  uint8_t n2;
  uint8_t n1;
  uint8_t n0;
  int padCount;
  uint32_t n;
  char *resultPtr;
  uint8_t *data;
  char base64chars [65];
  char *result_local;
  size_t dataLength_local;
  void *data_buf_local;
  
  unique0x10000128 = result;
  memcpy(&data,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/",0x41);
  _padCount = stack0xffffffffffffffe0;
  local_80 = (int)(dataLength % 3);
  for (local_90 = 0; local_90 < dataLength; local_90 = local_90 + 3) {
    _n3 = (uint)*(byte *)((long)data_buf + local_90) * 0x10000;
    if (local_90 + 1 < dataLength) {
      _n3 = (uint)*(byte *)((long)data_buf + local_90 + 1) * 0x100 + _n3;
    }
    if (local_90 + 2 < dataLength) {
      _n3 = *(byte *)((long)data_buf + local_90 + 2) + _n3;
    }
    *_padCount = base64chars[(ulong)((byte)(_n3 >> 0x12) & 0x3f) - 8];
    _padCount[1] = base64chars[(ulong)((byte)(_n3 >> 0xc) & 0x3f) - 8];
    pcVar1 = _padCount + 2;
    if (local_90 + 1 < dataLength) {
      _padCount[2] = base64chars[(ulong)((byte)(_n3 >> 6) & 0x3f) - 8];
      pcVar1 = _padCount + 3;
    }
    _padCount = pcVar1;
    if (local_90 + 2 < dataLength) {
      *_padCount = base64chars[(ulong)((byte)_n3 & 0x3f) - 8];
      _padCount = _padCount + 1;
    }
  }
  if (local_80 != 0) {
    for (; local_80 < 3; local_80 = local_80 + 1) {
      *_padCount = '=';
      _padCount = _padCount + 1;
    }
  }
  *_padCount = '\0';
  return (long)_padCount - (long)stack0xffffffffffffffe0;
}

Assistant:

size_t Jupiter_base64encode(const void *data_buf, size_t dataLength, char *result)
{
	const char base64chars[] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";
	const uint8_t *data = (const uint8_t *)data_buf;
	char *resultPtr = result;
	uint32_t n = 0;
	int padCount = dataLength % 3;
	uint8_t n0, n1, n2, n3;

	/* increment over the length of the string, three characters at a time */
	for (size_t x = 0; x < dataLength; x += 3)
	{
		/* these three 8-bit (ASCII) characters become one 24-bit number */
		n = data[x] << 16;

		if ((x + 1) < dataLength) n += data[x + 1] << 8;
		if ((x + 2) < dataLength) n += data[x + 2];

		/* this 24-bit number gets separated into four 6-bit numbers */
		n0 = (uint8_t)(n >> 18) & 63;
		n1 = (uint8_t)(n >> 12) & 63;
		n2 = (uint8_t)(n >> 6) & 63;
		n3 = (uint8_t)n & 63;

		/*
		* if we have one byte available, then its encoding is spread
		* out over two characters
		*/
		*resultPtr = base64chars[n0];
		resultPtr++;
		*resultPtr = base64chars[n1];
		resultPtr++;

		/*
		* if we have only two bytes available, then their encoding is
		* spread out over three chars
		*/
		if ((x + 1) < dataLength)
		{
			*resultPtr = base64chars[n2];
			resultPtr++;
		}

		/*
		* if we have all three bytes available, then their encoding is spread
		* out over four characters
		*/
		if ((x + 2) < dataLength)
		{
			*resultPtr = base64chars[n3];
			resultPtr++;
		}
	}

	/*
	* create and add padding that is required if we did not have a multiple of 3
	* number of characters available
	*/
	if (padCount > 0)
	{
		while (padCount < 3)
		{
			*resultPtr = '=';
			resultPtr++;
			padCount++;
		}
	}
	*resultPtr = 0;
	return resultPtr - result;
}